

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNativeOperators.cpp
# Opt level: O3

void * Js::JavascriptNativeOperators::Op_SwitchStringLookUp
                 (JavascriptString *str,
                 BranchDictionaryWrapper<Js::JavascriptString_*> *branchTargets,uintptr_t funcStart,
                 uintptr_t funcEnd)

{
  long lVar1;
  code *pcVar2;
  bool bVar3;
  hash_t hashCode;
  uint uVar4;
  uint uVar5;
  undefined4 *puVar7;
  JavascriptString *pJVar8;
  JavascriptString *local_48;
  JavascriptString *str_local;
  uintptr_t local_38;
  ulong uVar6;
  
  lVar1 = *(long *)branchTargets;
  str_local = *(JavascriptString **)(branchTargets + 0x38);
  uVar4 = 0;
  local_48 = str;
  local_38 = funcStart;
  if (lVar1 != 0) {
    hashCode = JsUtil::
               BaseDictionary<Js::JavascriptString*,void*,Js::BranchDictionaryWrapper<Js::JavascriptString*>::DictAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,Js::BranchDictionaryWrapper<Js::JavascriptString*>::SimpleDictionaryEntryWithFixUp,JsUtil::NoResizeLock>
               ::GetHashCodeWithKey<Js::JavascriptString*>(&local_48);
    uVar4 = JsUtil::
            BaseDictionary<Js::JavascriptString_*,_void_*,_Js::BranchDictionaryWrapper<Js::JavascriptString_*>::DictAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_Js::BranchDictionaryWrapper<Js::JavascriptString_*>::SimpleDictionaryEntryWithFixUp,_JsUtil::NoResizeLock>
            ::GetBucket(hashCode,*(int *)(branchTargets + 0x1c),*(int *)(branchTargets + 0x2c));
    uVar5 = *(uint *)(lVar1 + (ulong)uVar4 * 4);
    uVar4 = 0;
    if (-1 < (int)uVar5) {
      lVar1 = *(long *)(branchTargets + 8);
      uVar4 = 0;
      do {
        uVar6 = (ulong)uVar5;
        bVar3 = JavascriptString::Equals
                          (*(JavascriptString **)(lVar1 + 0x10 + uVar6 * 0x18),local_48);
        if (bVar3) {
          if (*(DictionaryStats **)(branchTargets + 0x30) != (DictionaryStats *)0x0) {
            DictionaryStats::Lookup(*(DictionaryStats **)(branchTargets + 0x30),uVar4);
          }
          pJVar8 = *(JavascriptString **)(*(long *)(branchTargets + 8) + uVar6 * 0x18);
          goto LAB_00565fd1;
        }
        uVar4 = uVar4 + 1;
        uVar5 = *(uint *)(lVar1 + uVar6 * 0x18 + 8);
      } while (-1 < (int)uVar5);
    }
  }
  pJVar8 = str_local;
  if (*(DictionaryStats **)(branchTargets + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(*(DictionaryStats **)(branchTargets + 0x30),uVar4);
    pJVar8 = str_local;
  }
LAB_00565fd1:
  if (funcEnd - local_38 < (long)pJVar8 - local_38) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JavascriptNativeOperators.cpp"
                                ,0x12,"((utarget - funcStart) <= (funcEnd - funcStart))",
                                "Switch string dictionary jump target outside of function");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  return pJVar8;
}

Assistant:

void * JavascriptNativeOperators::Op_SwitchStringLookUp(JavascriptString* str, Js::BranchDictionaryWrapper<JavascriptString*>* branchTargets, uintptr_t funcStart, uintptr_t funcEnd)
    {
        JIT_HELPER_NOT_REENTRANT_NOLOCK_HEADER(Op_SwitchStringLookUp);
        void* defaultTarget = branchTargets->defaultTarget;
        Js::BranchDictionaryWrapper<JavascriptString*>::BranchDictionary& stringDictionary = branchTargets->dictionary;
        void* target = stringDictionary.Lookup(str, defaultTarget);
        uintptr_t utarget = (uintptr_t)target;

        AssertOrFailFastMsg((utarget - funcStart) <= (funcEnd - funcStart), "Switch string dictionary jump target outside of function");
        return target;
        JIT_HELPER_END(Op_SwitchStringLookUp);
    }